

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkSuppSizeTest(Abc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Abc_Obj_t *pObj_00;
  abctime aVar4;
  abctime clk;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *p_local;
  
  clk._0_4_ = 0;
  aVar3 = Abc_Clock();
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->vObjs), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pObj_00 = Abc_NtkObj(p,clk._4_4_);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
      iVar1 = Abc_ObjSuppSize(pObj_00);
      clk._0_4_ = (iVar1 < 0x11) + (uint)clk;
    }
  }
  uVar2 = Abc_NtkNodeNum(p);
  printf("Nodes with small support %d (out of %d)\n",(ulong)(uint)clk,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return (uint)clk;
}

Assistant:

int Abc_NtkSuppSizeTest( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Abc_NtkForEachObj( p, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter += (Abc_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Abc_NtkNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}